

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall QNetworkRequestFactory::clearPassword(QNetworkRequestFactory *this)

{
  QArrayData *pQVar1;
  QNetworkRequestFactoryPrivate *pQVar2;
  
  pQVar2 = (this->d).d.ptr;
  if ((pQVar2->password).d.size != 0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
      pQVar2 = (this->d).d.ptr;
    }
    if ((pQVar2->password).d.ptr != (char16_t *)0x0) {
      pQVar1 = &((pQVar2->password).d.d)->super_QArrayData;
      (pQVar2->password).d.d = (Data *)0x0;
      (pQVar2->password).d.ptr = (char16_t *)0x0;
      (pQVar2->password).d.size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }